

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void remove_always_return_values(ListNode *map_head,size_t number_of_symbol_names)

{
  int iVar1;
  ListNode *in_RSI;
  unsigned_long *in_RDI;
  ListNode *child_node;
  ListNode *child_list;
  ListNode *next;
  SymbolMapValue *value;
  ListNode *current;
  ListNode *in_stack_ffffffffffffffc8;
  ListNode *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  unsigned_long *expression;
  unsigned_long in_stack_ffffffffffffffe0;
  unsigned_long result;
  unsigned_long *number_of_symbol_names_00;
  
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  number_of_symbol_names_00 = (unsigned_long *)in_RDI[2];
  while (number_of_symbol_names_00 != in_RDI) {
    result = *number_of_symbol_names_00;
    expression = (unsigned_long *)number_of_symbol_names_00[2];
    _assert_true(result,(char *)expression,(char *)in_stack_ffffffffffffffd0,
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    in_stack_ffffffffffffffd0 = (ListNode *)(result + 8);
    iVar1 = list_empty((ListNode *)0x178086);
    if (iVar1 == 0) {
      if (in_RSI == (ListNode *)0x1) {
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffd0->next;
        if (in_stack_ffffffffffffffc8->refcount < -1) {
          list_remove_free(in_stack_ffffffffffffffd0,(CleanupListValue)in_stack_ffffffffffffffc8,
                           (void *)0x1780be);
        }
      }
      else {
        remove_always_return_values(in_RSI,(size_t)number_of_symbol_names_00);
      }
    }
    iVar1 = list_empty((ListNode *)0x1780df);
    number_of_symbol_names_00 = expression;
    if (iVar1 != 0) {
      list_remove_free(in_stack_ffffffffffffffd0,(CleanupListValue)in_stack_ffffffffffffffc8,
                       (void *)0x1780f9);
      number_of_symbol_names_00 = expression;
    }
  }
  return;
}

Assistant:

static void remove_always_return_values(ListNode * const map_head,
                                        const size_t number_of_symbol_names) {
    ListNode *current;
    assert_non_null(map_head);
    assert_true(number_of_symbol_names);
    current = map_head->next;
    while (current != map_head) {
        SymbolMapValue * const value = (SymbolMapValue*)current->value;
        ListNode * const next = current->next;
        ListNode *child_list;
        assert_non_null(value);
        child_list = &value->symbol_values_list_head;

        if (!list_empty(child_list)) {
            if (number_of_symbol_names == 1) {
                ListNode * const child_node = child_list->next;
                /* If this item has been returned more than once, free it. */
                if (child_node->refcount < -1) {
                    list_remove_free(child_node, free_value, NULL);
                }
            } else {
                remove_always_return_values(child_list,
                                            number_of_symbol_names - 1);
            }
        }

        if (list_empty(child_list)) {
            list_remove_free(current, free_value, NULL);
        }
        current = next;
    }
}